

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::JsonReporter::~JsonReporter(JsonReporter *this)

{
  (this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener._vptr_IEventListener =
       (_func_int **)&PTR__JsonReporter_001a4bd8;
  endListing(this);
  endObject(this);
  std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,'\n');
  std::ostream::flush();
  std::_Deque_base<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>::
  ~_Deque_base((_Deque_base<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>
                *)&this->m_writers);
  std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>::~deque
            (&(this->m_arrayWriters).c);
  std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>::~deque
            (&(this->m_objectWriters).c);
  TeamCityReporter::~TeamCityReporter((TeamCityReporter *)this);
  return;
}

Assistant:

JsonReporter::~JsonReporter() {
        endListing();
        // TODO: Ensure this closes the top level object, add asserts
        assert( m_writers.size() == 1 && "Only the top level object should be open" );
        assert( m_writers.top() == Writer::Object );
        endObject();
        m_stream << '\n' << std::flush;
        assert( m_writers.empty() );
    }